

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_permissions.cpp
# Opt level: O1

bool NetWhitebindPermissions::TryParse
               (string *str,NetWhitebindPermissions *output,bilingual_str *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  DNSLookupFn dns_lookup_function;
  bool bVar3;
  uint16_t uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  _Alloc_hider _Var5;
  bool bVar6;
  long in_FS_OFFSET;
  size_t offset;
  NetPermissionFlags flags;
  optional<CService> addrBind;
  string strBind;
  _Function_base in_stack_fffffffffffffe98;
  pointer in_stack_fffffffffffffeb0;
  size_type local_140;
  NetPermissions local_134;
  char *local_130;
  long *local_128;
  long local_120;
  long local_118 [2];
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  bilingual_str local_c8;
  _Storage<CService,_false> local_88;
  char local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  _Alloc_hider local_38;
  
  local_38._M_p = *(pointer *)(in_FS_OFFSET + 0x28);
  bVar6 = false;
  bVar3 = anon_unknown.dwarf_2badbf3::TryParsePermissionFlags
                    (str,&local_134.m_flags,(ConnectionDirection *)0x0,&local_140,error);
  if (bVar3) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_58,str,local_140,0xffffffffffffffff);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)&stack0xfffffffffffffea0,&g_dns_lookup_abi_cxx11_);
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    dns_lookup_function._M_invoker = (_Invoker_type)in_stack_fffffffffffffeb0;
    dns_lookup_function.super__Function_base = in_stack_fffffffffffffe98;
    Lookup((optional<CService> *)&local_88._M_value,&local_58,0,false,dns_lookup_function);
    if (in_stack_fffffffffffffeb0 != (pointer)0x0) {
      (*(code *)in_stack_fffffffffffffeb0)
                ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)&stack0xfffffffffffffea0,
                 (_Any_data *)&stack0xfffffffffffffea0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3,
                 (bool *)args);
    }
    if (local_60 == '\0') {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"whitebind","");
      common::ResolveErrMsg(&local_c8,&local_108,&local_58);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->original,&local_c8.original);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->translated,&local_c8.translated);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.translated._M_dataplus._M_p != &local_c8.translated.field_2) {
        operator_delete(local_c8.translated._M_dataplus._M_p,
                        local_c8.translated.field_2._M_allocated_capacity + 1);
      }
      _Var5._M_p = local_c8.original._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.original._M_dataplus._M_p != &local_c8.original.field_2) {
LAB_006cb81b:
        operator_delete(_Var5._M_p,local_c8.original.field_2._M_allocated_capacity + 1);
      }
LAB_006cb823:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      bVar6 = false;
    }
    else {
      uVar4 = CService::GetPort(&local_88._M_value);
      if (uVar4 == 0) {
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,"Need to specify a port with -whitebind: \'%s\'","");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e8,"Need to specify a port with -whitebind: \'%s\'","");
        }
        else {
          local_130 = "Need to specify a port with -whitebind: \'%s\'";
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (&local_e8,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,&local_130);
        }
        tinyformat::format<std::__cxx11::string>
                  (&local_c8,(tinyformat *)&local_108,(bilingual_str *)&local_58,args);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&error->original,&local_c8.original);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&error->translated,&local_c8.translated);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.translated._M_dataplus._M_p != &local_c8.translated.field_2) {
          operator_delete(local_c8.translated._M_dataplus._M_p,
                          local_c8.translated.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.original._M_dataplus._M_p != &local_c8.original.field_2) {
          operator_delete(local_c8.original._M_dataplus._M_p,
                          local_c8.original.field_2._M_allocated_capacity + 1);
        }
        local_c8.original.field_2._M_allocated_capacity = local_e8.field_2._M_allocated_capacity;
        _Var5._M_p = local_e8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) goto LAB_006cb81b;
        goto LAB_006cb823;
      }
      (output->super_NetPermissions).m_flags = local_134.m_flags;
      if (local_60 == '\0') {
        if (*(pointer *)(in_FS_OFFSET + 0x28) == local_38._M_p) {
          std::__throw_bad_optional_access();
        }
        goto LAB_006cb9fc;
      }
      prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&output->m_service,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_88._M_value);
      (output->m_service).super_CNetAddr.m_net = local_88._24_4_;
      (output->m_service).super_CNetAddr.m_scope_id = local_88._M_value.super_CNetAddr.m_scope_id;
      (output->m_service).port = local_88._M_value.port;
      local_128 = local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"");
      paVar1 = &local_c8.original.field_2;
      local_c8.original._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,local_128,local_120 + (long)local_128);
      paVar2 = &local_c8.translated.field_2;
      local_c8.translated._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8.translated,local_128,local_120 + (long)local_128);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->original,&local_c8.original);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&error->translated,&local_c8.translated);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.translated._M_dataplus._M_p != paVar2) {
        operator_delete(local_c8.translated._M_dataplus._M_p,
                        local_c8.translated.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.original._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8.original._M_dataplus._M_p,
                        local_c8.original.field_2._M_allocated_capacity + 1);
      }
      if (local_128 != local_118) {
        operator_delete(local_128,local_118[0] + 1);
      }
      bVar6 = true;
    }
    if ((local_60 == '\x01') &&
       (local_60 = '\0', 0x10 < local_88._M_value.super_CNetAddr.m_addr._size)) {
      free((void *)local_88._0_8_);
      local_88._0_8_ = (void *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_38._M_p) {
    return bVar6;
  }
LAB_006cb9fc:
  __stack_chk_fail();
}

Assistant:

bool NetWhitebindPermissions::TryParse(const std::string& str, NetWhitebindPermissions& output, bilingual_str& error)
{
    NetPermissionFlags flags;
    size_t offset;
    if (!TryParsePermissionFlags(str, flags, /*output_connection_direction=*/nullptr, offset, error)) return false;

    const std::string strBind = str.substr(offset);
    const std::optional<CService> addrBind{Lookup(strBind, 0, false)};
    if (!addrBind.has_value()) {
        error = ResolveErrMsg("whitebind", strBind);
        return false;
    }
    if (addrBind.value().GetPort() == 0) {
        error = strprintf(_("Need to specify a port with -whitebind: '%s'"), strBind);
        return false;
    }

    output.m_flags = flags;
    output.m_service = addrBind.value();
    error = Untranslated("");
    return true;
}